

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

string * __thiscall
inja::DataNode::convert_dot_to_ptr_abi_cxx11_
          (string *__return_storage_ptr__,DataNode *this,string_view ptr_name)

{
  string_view view;
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  basic_string_view<char,_std::char_traits<char>_> local_88 [2];
  DataNode *local_68;
  size_t sStack_60;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_58;
  undefined1 local_38 [8];
  string_view part;
  undefined1 auStack_20 [8];
  string_view ptr_name_local;
  string *result;
  
  ptr_name_local._M_len = ptr_name._M_len;
  part._M_str._7_1_ = 0;
  auStack_20 = (undefined1  [8])this;
  ptr_name_local._M_str = (char *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  do {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    local_68 = (DataNode *)auStack_20;
    sStack_60 = ptr_name_local._M_len;
    view._M_str = (char *)ptr_name_local._M_len;
    view._M_len = (size_t)auStack_20;
    string_view::split(&local_58,view,'.');
    ::std::
    tie<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (local_88,(basic_string_view<char,_std::char_traits<char>_> *)local_38);
    ::std::
    tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
    ::operator=((tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                 *)local_88,&local_58);
    ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    __first = std::basic_string_view<char,_std::char_traits<char>_>::begin
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    __last = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    ::std::__cxx11::string::append<char_const*,void>
              ((string *)__return_storage_ptr__,__first,__last);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert_dot_to_ptr(std::string_view ptr_name) {
    std::string result;
    do {
      std::string_view part;
      std::tie(part, ptr_name) = string_view::split(ptr_name, '.');
      result.push_back('/');
      result.append(part.begin(), part.end());
    } while (!ptr_name.empty());
    return result;
  }